

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  int ret;
  int local_28;
  short local_22;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1e;
  int local_1c;
  
  result_00 = &local_20;
  local_20.m_int = 0;
  local_28 = lhs;
  bVar1 = DivisionCornerCaseHelper2<short,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2(lhs,rhs,result_00);
  if (!bVar1) {
    local_1c = 0;
    local_22 = rhs.m_int;
    DivisionHelper<int,_short,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_28,&local_22,&local_1c);
    result_00 = &local_1e;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (result_00,&local_1c);
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}